

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O3

void __thiscall MinVR::VRDataIndex::VRDataIndex(VRDataIndex *this,string *serializedData)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  char *pcVar5;
  Cxml *this_00;
  element *this_01;
  element *this_02;
  element *node;
  char *__s;
  string out;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  psVar2 = &this->_indexName;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_lastDatum)._M_node = (_Base_ptr)0x0;
  (this->_indexName)._M_dataplus._M_p = (pointer)&(this->_indexName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"MVR","");
  this->_overwrite = 1;
  p_Var3 = &(this->_linkRegister)._M_t._M_impl.super__Rb_tree_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_linkNeeded = false;
  (this->_lastDatum)._M_node = &p_Var1->_M_header;
  if (*(serializedData->_M_dataplus)._M_p == '<') {
    this_00 = (Cxml *)operator_new(0x10);
    Cxml::Cxml(this_00);
    pcVar4 = (serializedData->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + serializedData->_M_string_length);
    Cxml::parse_string(this_00,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    this_01 = Cxml::get_root_element(this_00);
    this_02 = element::get_next_child(this_01);
    node = element::get_next_child(this_02);
    local_b0 = &local_a0;
    local_a8 = 0;
    local_a0 = 0;
    while (this_02 != (element *)0x0) {
      __s = element::get_name(this_02);
      pcVar5 = (char *)(this->_indexName)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)psVar2,0,pcVar5,(ulong)__s);
      while (node != (element *)0x0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
        _walkXML(&local_50,this,node,&local_90);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        node = element::get_next_child(this_02);
      }
      this_02 = element::get_next_child(this_01);
      node = (element *)0x0;
    }
    Cxml::~Cxml(this_00);
    operator_delete(this_00,0x10);
    if (this->_linkNeeded == true) {
      _linkNodes(this);
      _linkContent(this);
      this->_linkNeeded = false;
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  return;
}

Assistant:

VRDataIndex::VRDataIndex(const std::string serializedData)  :
  _indexName("MVR"), _overwrite(1), _linkNeeded(false) {

  _lastDatum = _theIndex.end();

  // If this is just a name, we just need an empty data index with the
  // given name.
  if (serializedData[0] != '<') {
    _indexName = serializedData;
    return;
  }

  // If you're here, the input data looks like XML. So parse it.
  Cxml *xml = new Cxml();
  xml->parse_string(serializedData);
  element *xml_node = xml->get_root_element();
  element* child = xml_node->get_next_child();
  element* grandChild = child->get_next_child();
  std::string out;

  // If we have been given data from a valid XML file (which has only
  // one root element), the 'child' points to the root node, which we
  // don't want to keep.  So we'll work our way through the
  // grandchildren in this loop.
  while (child != NULL) {

    // There should be only one child here, so this should only pick
    // the root name off the serial data.
    _indexName = child->get_name();

    // Now scan through the child's children for the rest of the data.
    while (grandChild != NULL) {

      out = _walkXML(grandChild, "/");

      grandChild = child->get_next_child();
    }

    child = xml_node->get_next_child();
  }

  delete xml;

  // If there are nodes in the tree with a 'linknode' attribute,
  // resolve them.
  if (_linkNeeded) {
    _linkNodes();
    _linkContent();
    _linkNeeded = false;
  }

}